

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

SQInteger __thiscall
SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr,int *hint,bool *is_line_op)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  SQLineInfo *pSVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  lVar3 = this->_nlineinfos;
  iVar7 = (int)lVar3 + -1;
  iVar6 = (int)((ulong)((long)curr + (-0xf8 - (long)this)) >> 3);
  if (hint == (int *)0x0) goto LAB_0013a329;
  iVar10 = *hint;
  lVar9 = (long)iVar10;
  if (iVar7 <= iVar10) goto LAB_0013a329;
  pSVar5 = this->_lineinfos;
  if ((pSVar5[lVar9]._op < iVar6) && (iVar6 <= pSVar5[lVar9 + 1]._op)) {
LAB_0013a2f0:
    if (is_line_op != (bool *)0x0) {
      *is_line_op = SUB41((uint)*(undefined4 *)&pSVar5[lVar9].field_0x4 >> 0x1f,0);
    }
    pSVar5 = pSVar5 + lVar9;
LAB_0013a309:
    pSVar5 = (SQLineInfo *)(ulong)(*(uint *)&pSVar5->field_0x4 & 0x7fffffff);
    bVar4 = false;
  }
  else {
    if (pSVar5[lVar9 + 1]._op + 1 == iVar6) {
      lVar9 = lVar9 + 1;
      *hint = iVar10 + 1;
      goto LAB_0013a2f0;
    }
    if (iVar6 == 0) {
      if (is_line_op != (bool *)0x0) {
        *is_line_op = SUB41((uint)*(undefined4 *)&pSVar5[lVar9].field_0x4 >> 0x1f,0);
      }
      goto LAB_0013a309;
    }
    bVar4 = true;
  }
  if (!bVar4) {
    return (SQInteger)pSVar5;
  }
LAB_0013a329:
  if (iVar7 < 0) {
    uVar8 = 0;
  }
  else {
    iVar10 = 0;
    do {
      uVar8 = (iVar7 - iVar10 >> 1) + iVar10;
      lVar9 = (long)(int)uVar8;
      iVar1 = this->_lineinfos[lVar9]._op;
      if (iVar6 < iVar1) {
        iVar7 = uVar8 - 1;
LAB_0013a36a:
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if ((iVar1 < iVar6) && ((lVar3 + -1 <= lVar9 || (this->_lineinfos[lVar9 + 1]._op < iVar6))))
        {
          iVar10 = uVar8 + 1;
          goto LAB_0013a36a;
        }
      }
    } while ((!bVar4) && (iVar10 <= iVar7));
  }
  if (0 < (int)uVar8) {
    do {
      if (this->_lineinfos[uVar8]._op < iVar6) goto LAB_0013a39f;
      bVar4 = 1 < (int)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar4);
    uVar8 = 0;
  }
LAB_0013a39f:
  uVar2 = *(uint *)&this->_lineinfos[(int)uVar8].field_0x4;
  if (is_line_op != (bool *)0x0) {
    *is_line_op = SUB41(uVar2 >> 0x1f,0);
  }
  if (hint != (int *)0x0) {
    *hint = uVar8;
  }
  return (ulong)(uVar2 & 0x7fffffff);
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr, int *hint, bool *is_line_op)
{
    int op = (int)(curr-_instructions);
    int high = _nlineinfos - 1;

    if (hint && *hint < high) {
        int pos = *hint;
        if (op > _lineinfos[pos]._op && op <= _lineinfos[pos + 1]._op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (op == _lineinfos[pos + 1]._op + 1) {
            *hint = ++pos;
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (!op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[0]._line;
        }
    }

    int line = 0;
    int low = 0;
    int mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        int curop = _lineinfos[mid]._op;
        if(curop > op) {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    if (is_line_op)
        *is_line_op = _lineinfos[mid]._is_line_op;

    if (hint)
        *hint = mid;

    return line;
}